

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

UCVarValue __thiscall FMaskCVar::GetFavoriteRepDefault(FMaskCVar *this,ECVarType *type)

{
  uint uVar1;
  undefined4 extraout_var;
  UCVarValue UVar2;
  ECVarType dummy;
  undefined1 local_14 [4];
  
  uVar1 = (*(this->ValueVar->super_FBaseCVar)._vptr_FBaseCVar[7])(this->ValueVar,local_14);
  UVar2._4_4_ = extraout_var;
  UVar2.Int = (this->BitVal & uVar1) >> ((byte)this->BitNum & 0x1f);
  *type = CVAR_Int;
  return (UCVarValue)UVar2.String;
}

Assistant:

UCVarValue FMaskCVar::GetFavoriteRepDefault (ECVarType *type) const
{
	ECVarType dummy;
	UCVarValue def;
	def = ValueVar.GetFavoriteRepDefault (&dummy);
	def.Int = (def.Int & BitVal) >> BitNum;
	*type = CVAR_Int;
	return def;
}